

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableModel::setVerticalHeaderItem(QTableModel *this,int section,QTableWidgetItem *item)

{
  qsizetype qVar1;
  const_reference ppQVar2;
  QTableWidget *pQVar3;
  reference ppQVar4;
  QTableWidgetItem *in_RDX;
  int in_ESI;
  long in_RDI;
  QTableWidget *view;
  QTableWidgetItem *oldItem;
  qsizetype in_stack_ffffffffffffffb8;
  QList<QTableWidgetItem_*> *in_stack_ffffffffffffffc0;
  QTableWidgetItem *this_00;
  
  if ((-1 < in_ESI) &&
     (qVar1 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x30)),
     in_ESI < qVar1)) {
    ppQVar2 = QList<QTableWidgetItem_*>::at(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = *ppQVar2;
    if (in_RDX != this_00) {
      if (this_00 != (QTableWidgetItem *)0x0) {
        this_00->view = (QTableWidget *)0x0;
        (*this_00->_vptr_QTableWidgetItem[1])();
      }
      pQVar3 = QTableModel::view((QTableModel *)0x8d5807);
      if (in_RDX != (QTableWidgetItem *)0x0) {
        in_RDX->view = pQVar3;
        in_RDX->d->headerItem = true;
      }
      ppQVar4 = QList<QTableWidgetItem_*>::operator[]
                          ((QList<QTableWidgetItem_*> *)this_00,(qsizetype)in_RDX);
      *ppQVar4 = in_RDX;
      QAbstractItemModel::headerDataChanged((Orientation)in_RDI,2,in_ESI);
    }
  }
  return;
}

Assistant:

void QTableModel::setVerticalHeaderItem(int section, QTableWidgetItem *item)
{
    if (section < 0 || section >= verticalHeaderItems.size())
        return;
    QTableWidgetItem *oldItem = verticalHeaderItems.at(section);
    if (item == oldItem)
        return;

    if (oldItem)
        oldItem->view = nullptr;
    delete oldItem;

    QTableWidget *view = this->view();

    if (item) {
        item->view = view;
        item->d->headerItem = true;
    }
    verticalHeaderItems[section] = item;
    emit headerDataChanged(Qt::Vertical, section, section);
}